

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O1

void compact_vector_suite::test_int64(void)

{
  long lVar1;
  vector<long,_std::allocator<long>_> value;
  iarchive in;
  value_type input [34];
  vector<long,_std::allocator<long>_> local_f8;
  undefined8 local_e0;
  iarchive local_d8;
  uchar local_38 [48];
  
  local_38[0x10] = 'b';
  local_38[0x11] = 'r';
  local_38[0x12] = '\x03';
  local_38[0x13] = '\x13';
  local_38[0x14] = '#';
  local_38[0x15] = '3';
  local_38[0x16] = 'C';
  local_38[0x17] = 'S';
  local_38[0x18] = 'c';
  local_38[0x19] = 's';
  local_38[0x1a] = '\x04';
  local_38[0x1b] = '\x14';
  local_38[0x1c] = '$';
  local_38[0x1d] = '4';
  local_38[0x1e] = 'D';
  local_38[0x1f] = 'T';
  local_38[0] = 0xae;
  local_38[1] = ' ';
  local_38[2] = '\x01';
  local_38[3] = '\x11';
  local_38[4] = '!';
  local_38[5] = '1';
  local_38[6] = 'A';
  local_38[7] = 'Q';
  local_38[8] = 'a';
  local_38[9] = 'q';
  local_38[10] = '\x02';
  local_38[0xb] = '\x12';
  local_38[0xc] = '\"';
  local_38[0xd] = '2';
  local_38[0xe] = 'B';
  local_38[0xf] = 'R';
  local_38[0x20] = 'd';
  local_38[0x21] = 't';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[34]>
            (&local_d8,(uchar (*) [34])local_38);
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(0x20);
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start + 4;
  lVar1 = 0;
  do {
    *(undefined8 *)
     ((long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start + lVar1) = 0x7fffffffffffffff;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_std::vector<long,_std::allocator<long>_>,_void>
  ::load(&local_d8,&local_f8,0);
  local_e0 = 0x7161514131211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[0]","INT64_C(0x7161514131211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x284,"void compact_vector_suite::test_int64()",
             local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,&local_e0);
  local_e0 = 0x7262524232221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[1]","INT64_C(0x7262524232221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x285,"void compact_vector_suite::test_int64()",
             local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_e0);
  local_e0 = 0x7363534333231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[2]","INT64_C(0x7363534333231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x286,"void compact_vector_suite::test_int64()",
             local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start + 2,&local_e0);
  local_e0 = 0x7464544434241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[3]","INT64_C(0x7464544434241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x287,"void compact_vector_suite::test_int64()",
             local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start + 3,&local_e0);
  if (local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_d8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_001297c8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_d8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_d8);
  return;
}

Assistant:

void test_int64()
{
    const value_type input[] = { token::code::array8_int64, 4 * token::int64::size,
                                 0x01, 0x11, 0x21, 0x31, 0x41, 0x51, 0x61, 0x71,
                                 0x02, 0x12, 0x22, 0x32, 0x42, 0x52, 0x62, 0x72,
                                 0x03, 0x13, 0x23, 0x33, 0x43, 0x53, 0x63, 0x73,
                                 0x04, 0x14, 0x24, 0x34, 0x44, 0x54, 0x64, 0x74 };
    format::iarchive in(input);
    std::vector<std::int64_t> value(4, std::numeric_limits<std::int64_t>::max());
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT64_C(0x7161514131211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT64_C(0x7262524232221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT64_C(0x7363534333231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT64_C(0x7464544434241404));
}